

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkPlusString(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  bool bVar2;
  TreeOp TVar3;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *unaff_retaddr;
  CheckerVisitor *in_stack_00000008;
  bool sr;
  bool sl;
  Expr *r;
  Expr *l;
  Expr *in_stack_ffffffffffffffc8;
  
  if (((in_RDI->effectsOnly & 1U) == 0) &&
     ((TVar3 = Node::op((Node *)in_RSI), TVar3 == TO_ADD ||
      (TVar3 = Node::op((Node *)in_RSI), TVar3 == TO_PLUSEQ)))) {
    BinExpr::lhs(in_RSI);
    maybeEval(in_RDI,in_stack_ffffffffffffffc8,false);
    BinExpr::rhs(in_RSI);
    maybeEval(in_RDI,in_stack_ffffffffffffffc8,false);
    bVar1 = couldBeString(in_stack_00000008,unaff_retaddr);
    bVar2 = couldBeString(in_stack_00000008,unaff_retaddr);
    if (bVar1 != bVar2) {
      report(in_RDI,(Node *)in_RSI,0x6a);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPlusString(const BinExpr *bin) {
  if (effectsOnly)
    return;

  if (bin->op() != TO_ADD && bin->op() != TO_PLUSEQ)
    return;

  const Expr *l = maybeEval(bin->lhs());
  const Expr *r = maybeEval(bin->rhs());

  bool sl = couldBeString(l);
  bool sr = couldBeString(r);

  if (bool(sl) != bool(sr)) {
    report(bin, DiagnosticsId::DI_PLUS_STRING);
  }
}